

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_match.cpp
# Opt level: O2

void __thiscall
pfederc::Parser::parseMatchCases
          (Parser *this,bool *err,
          vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
          *cases)

{
  bool bVar1;
  bool *err_00;
  MatchPattern matchPattern;
  
  while( true ) {
    bVar1 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    if (!bVar1) {
      return;
    }
    bVar1 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
    if (!bVar1) break;
    bVar1 = Token::operator!=(this->lexer->currentToken,TOK_ANY);
    if (!bVar1) {
      return;
    }
    skipEol(this);
    parseMatchCase(&matchPattern,this,err_00);
    if ((matchPattern.
         super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
         .super__Head_base<0UL,_const_pfederc::Token_*,_false>._M_head_impl != (Token *)0x0) &&
       (matchPattern.
        super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        .
        super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        .
        super__Tuple_impl<2UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        .
        super__Head_base<2UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
        ._M_head_impl._M_t.
        super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl !=
        (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0)) {
      std::
      vector<std::tuple<pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
      ::
      emplace_back<std::tuple<pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>
                ((vector<std::tuple<pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>
                  *)cases,&matchPattern);
    }
    std::
    _Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
    ::~_Tuple_impl((_Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                    *)&matchPattern);
  }
  return;
}

Assistant:

void Parser::parseMatchCases(bool &err,
    std::vector<MatchPattern> &cases) noexcept {

  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF
      && *lexer.getCurrentToken() != TokenType::TOK_ANY) {
    skipEol();

    MatchPattern matchPattern = parseMatchCase(err);
    if (std::get<0>(matchPattern) && std::get<2>(matchPattern))
      cases.push_back(std::move(matchPattern));
  }
}